

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O0

bool __thiscall
pbrt::BasicTextureEvaluator::CanEvaluate
          (BasicTextureEvaluator *this,initializer_list<pbrt::FloatTextureHandle> ftex,
          initializer_list<pbrt::SpectrumTextureHandle> stex)

{
  bool bVar1;
  const_iterator pSVar2;
  SpectrumTextureHandle s;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  initializer_list<pbrt::SpectrumTextureHandle> *__range2_1;
  FloatTextureHandle f;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<pbrt::FloatTextureHandle> *__range2;
  FloatTextureHandle *in_stack_ffffffffffffff88;
  initializer_list<pbrt::FloatTextureHandle> *in_stack_ffffffffffffff90;
  const_iterator local_60;
  TaggedPointer local_50 [8];
  const_iterator local_48;
  const_iterator local_40;
  initializer_list<pbrt::FloatTextureHandle> *local_38;
  initializer_list<pbrt::SpectrumTextureHandle> local_28;
  initializer_list<pbrt::FloatTextureHandle> local_18;
  
  local_38 = &local_18;
  local_40 = std::initializer_list<pbrt::FloatTextureHandle>::begin(local_38);
  local_48 = std::initializer_list<pbrt::FloatTextureHandle>::end(in_stack_ffffffffffffff90);
  while( true ) {
    if (local_40 == local_48) {
      local_60 = std::initializer_list<pbrt::SpectrumTextureHandle>::begin(&local_28);
      pSVar2 = std::initializer_list<pbrt::SpectrumTextureHandle>::end
                         ((initializer_list<pbrt::SpectrumTextureHandle> *)in_stack_ffffffffffffff90
                         );
      while( true ) {
        if (local_60 == pSVar2) {
          return true;
        }
        SpectrumTextureHandle::SpectrumTextureHandle
                  ((SpectrumTextureHandle *)in_stack_ffffffffffffff90,
                   (SpectrumTextureHandle *)in_stack_ffffffffffffff88);
        bVar1 = pbrt::TaggedPointer::operator_cast_to_bool
                          ((TaggedPointer *)&stack0xffffffffffffff90);
        if (((bVar1) &&
            (bVar1 = TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                     ::Is<pbrt::SpectrumConstantTexture>
                               ((TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                                 *)in_stack_ffffffffffffff90), !bVar1)) &&
           ((bVar1 = TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                     ::Is<pbrt::RGBConstantTexture>
                               ((TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                                 *)in_stack_ffffffffffffff90), !bVar1 &&
            ((bVar1 = TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                      ::Is<pbrt::RGBReflectanceConstantTexture>
                                ((TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                                  *)in_stack_ffffffffffffff90), !bVar1 &&
             (bVar1 = TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                      ::Is<pbrt::GPUSpectrumImageTexture>
                                ((TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                                  *)in_stack_ffffffffffffff90), !bVar1)))))) break;
        local_60 = local_60 + 1;
      }
      return false;
    }
    FloatTextureHandle::FloatTextureHandle
              ((FloatTextureHandle *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_50);
    if (((bVar1) &&
        (bVar1 = TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                 ::Is<pbrt::FloatConstantTexture>
                           ((TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                             *)in_stack_ffffffffffffff90), !bVar1)) &&
       (bVar1 = TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                ::Is<pbrt::GPUFloatImageTexture>
                          ((TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                            *)in_stack_ffffffffffffff90), !bVar1)) break;
    local_40 = local_40 + 1;
  }
  return false;
}

Assistant:

PBRT_CPU_GPU
    bool CanEvaluate(std::initializer_list<FloatTextureHandle> ftex,
                     std::initializer_list<SpectrumTextureHandle> stex) const {
        for (auto f : ftex)
            if (f && (!f.Is<FloatConstantTexture>() && !f.Is<GPUFloatImageTexture>())) {
                return false;
            }
        for (auto s : stex)
            if (s && (!s.Is<SpectrumConstantTexture>() && !s.Is<RGBConstantTexture>() &&
                      !s.Is<RGBReflectanceConstantTexture>() &&
                      !s.Is<GPUSpectrumImageTexture>())) {
                return false;
            }
        return true;
    }